

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

uint32_t __thiscall
diligent_spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::get_minimum_scalar_alignment
          (PhysicalStorageBufferPointerHandler *this,SPIRType *type)

{
  TypedID<(diligent_spirv_cross::Types)1> *pTVar1;
  size_t sVar2;
  uint32_t uVar3;
  SPIRType *type_00;
  uint32_t uVar4;
  long lVar5;
  
  if (type->storage == PhysicalStorageBuffer) {
    uVar4 = 8;
  }
  else if (type->basetype == Struct) {
    pTVar1 = (type->member_types).
             super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.ptr;
    sVar2 = (type->member_types).
            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
            buffer_size;
    uVar4 = 0;
    for (lVar5 = 0; sVar2 << 2 != lVar5; lVar5 = lVar5 + 4) {
      type_00 = get<diligent_spirv_cross::SPIRType>
                          (this->compiler,*(uint32_t *)((long)&pTVar1->id + lVar5));
      uVar3 = get_minimum_scalar_alignment(this,type_00);
      if (uVar4 < uVar3) {
        uVar4 = uVar3;
      }
    }
  }
  else {
    uVar4 = type->width >> 3;
  }
  return uVar4;
}

Assistant:

uint32_t Compiler::PhysicalStorageBufferPointerHandler::get_minimum_scalar_alignment(const SPIRType &type) const
{
	if (type.storage == spv::StorageClassPhysicalStorageBufferEXT)
		return 8;
	else if (type.basetype == SPIRType::Struct)
	{
		uint32_t alignment = 0;
		for (auto &member_type : type.member_types)
		{
			uint32_t member_align = get_minimum_scalar_alignment(compiler.get<SPIRType>(member_type));
			if (member_align > alignment)
				alignment = member_align;
		}
		return alignment;
	}
	else
		return type.width / 8;
}